

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_flags nk_edit_string(nk_context *ctx,nk_flags flags,char *memory,int *len,int max,
                       nk_plugin_filter filter)

{
  nk_str *__s;
  undefined8 *puVar1;
  nk_scroll nVar2;
  uint uVar3;
  nk_window *pnVar4;
  uchar uVar5;
  nk_flags nVar6;
  int iVar7;
  code *filter_00;
  ulong __n;
  nk_size nVar8;
  float fVar9;
  undefined8 uVar10;
  nk_vec2 nVar11;
  float fVar13;
  undefined1 auVar12 [16];
  int iVar14;
  
  nVar6 = 0;
  if (len != (int *)0x0 && (memory != (char *)0x0 && ctx != (nk_context *)0x0)) {
    filter_00 = nk_filter_default;
    if (filter != (nk_plugin_filter)0x0) {
      filter_00 = filter;
    }
    pnVar4 = ctx->current;
    uVar3 = (pnVar4->edit).seq;
    (ctx->text_edit).undo.undo_point = 0;
    (ctx->text_edit).undo.redo_point = 99;
    (ctx->text_edit).undo.undo_char_point = 0;
    (ctx->text_edit).undo.redo_char_point = 999;
    (ctx->text_edit).cursor = 0;
    (ctx->text_edit).select_start = 0;
    (ctx->text_edit).select_end = 0;
    (ctx->text_edit).mode = '\0';
    (ctx->text_edit).cursor_at_end_of_line = '\0';
    (ctx->text_edit).initialized = '\x01';
    (ctx->text_edit).has_preferred_x = '\0';
    (ctx->text_edit).preferred_x = 0.0;
    (ctx->text_edit).single_line = (flags >> 10 & 1) == 0;
    (ctx->text_edit).filter = filter_00;
    (ctx->text_edit).scrollbar.x = 0.0;
    (ctx->text_edit).scrollbar.y = 0.0;
    if (((pnVar4->edit).active == 0) || (uVar3 != (pnVar4->edit).name)) {
      uVar5 = '\0';
    }
    else {
      if ((flags & 0x10) == 0) {
        iVar7 = (pnVar4->edit).cursor;
      }
      else {
        iVar7 = nk_utf_len(memory,*len);
      }
      (ctx->text_edit).cursor = iVar7;
      if ((flags & 0x20) == 0) {
        iVar7 = (pnVar4->edit).cursor;
        uVar10 = CONCAT44(iVar7,iVar7);
      }
      else {
        uVar10._0_4_ = (pnVar4->edit).sel_start;
        uVar10._4_4_ = (pnVar4->edit).sel_end;
      }
      (ctx->text_edit).select_start = (int)uVar10;
      (ctx->text_edit).select_end = (int)((ulong)uVar10 >> 0x20);
      (ctx->text_edit).mode = (pnVar4->edit).mode;
      nVar2 = (pnVar4->edit).scrollbar;
      auVar12._0_8_ = (ulong)nVar2 & 0xffffffff;
      auVar12._8_4_ = nVar2.y;
      auVar12._12_4_ = 0;
      nVar11.x = (float)(SUB168(auVar12 | _DAT_0015b4b0,0) - (double)DAT_0015b4b0);
      nVar11.y = (float)(SUB168(auVar12 | _DAT_0015b4b0,8) - DAT_0015b4b0._8_8_);
      (ctx->text_edit).scrollbar = nVar11;
      uVar5 = '\x01';
    }
    (ctx->text_edit).active = uVar5;
    nVar8 = 1;
    if (1 < max) {
      nVar8 = (nk_size)(uint)max;
    }
    iVar7 = (int)nVar8 + -1;
    if (*len < iVar7) {
      iVar7 = *len;
    }
    *len = iVar7;
    __s = &(ctx->text_edit).string;
    __n = (ulong)__s & 3;
    if (__n == 0) {
      (ctx->text_edit).string.buffer.needed = 0;
      (ctx->text_edit).string.buffer.calls = 0;
      *(undefined8 *)&(ctx->text_edit).string.buffer.grow_factor = 0;
      (ctx->text_edit).string.buffer.allocated = 0;
      (ctx->text_edit).string.buffer.memory.ptr = (void *)0x0;
      (ctx->text_edit).string.buffer.memory.size = 0;
      (ctx->text_edit).string.buffer.pool.free = (nk_plugin_free)0x0;
      *(undefined8 *)&(ctx->text_edit).string.buffer.type = 0;
      (ctx->text_edit).string.buffer.pool.userdata.ptr = (void *)0x0;
      (ctx->text_edit).string.buffer.pool.alloc = (nk_plugin_alloc)0x0;
      *(undefined8 *)((ctx->text_edit).string.buffer.marker + 1) = 0;
      (ctx->text_edit).string.buffer.marker[1].offset = 0;
      *(undefined8 *)(__s->buffer).marker = 0;
      (ctx->text_edit).string.buffer.marker[0].offset = 0;
    }
    else {
      memset(__s,0,4 - __n);
      puVar1 = (undefined8 *)((4 - __n) + (long)__s);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1[4] = 0;
      puVar1[5] = 0;
      puVar1[6] = 0;
      puVar1[7] = 0;
      puVar1[8] = 0;
      puVar1[9] = 0;
      puVar1[10] = 0;
      puVar1[0xb] = 0;
      puVar1[0xc] = 0;
      puVar1[0xd] = 0;
      *(undefined4 *)(puVar1 + 0xe) = 0;
      memset((void *)((long)puVar1 + 0x74),0,__n);
    }
    (ctx->text_edit).string.buffer.type = NK_BUFFER_FIXED;
    (ctx->text_edit).string.buffer.memory.ptr = memory;
    (ctx->text_edit).string.buffer.memory.size = nVar8;
    (ctx->text_edit).string.buffer.size = nVar8;
    (ctx->text_edit).string.len = 0;
    iVar7 = *len;
    (ctx->text_edit).string.buffer.allocated = (long)iVar7;
    iVar7 = nk_utf_len(memory,iVar7);
    (ctx->text_edit).string.len = iVar7;
    nVar6 = nk_edit_buffer(ctx,flags,&ctx->text_edit,filter_00);
    *len = (int)(ctx->text_edit).string.buffer.allocated;
    if ((ctx->text_edit).active != '\0') {
      iVar7 = (ctx->text_edit).select_start;
      (pnVar4->edit).cursor = (ctx->text_edit).cursor;
      (pnVar4->edit).sel_start = iVar7;
      (pnVar4->edit).sel_end = (ctx->text_edit).select_end;
      (pnVar4->edit).mode = (ctx->text_edit).mode;
      nVar11 = (ctx->text_edit).scrollbar;
      fVar9 = nVar11.x;
      iVar7 = (int)fVar9;
      fVar13 = nVar11.y;
      iVar14 = (int)fVar13;
      (pnVar4->edit).scrollbar =
           (nk_scroll)
           (CONCAT44((int)(fVar13 - 2.1474836e+09),(int)(fVar9 - 2.1474836e+09)) &
            CONCAT44(iVar14 >> 0x1f,iVar7 >> 0x1f) | CONCAT44(iVar14,iVar7));
    }
  }
  return nVar6;
}

Assistant:

NK_API nk_flags
nk_edit_string(struct nk_context *ctx, nk_flags flags,
char *memory, int *len, int max, nk_plugin_filter filter)
{
nk_hash hash;
nk_flags state;
struct nk_text_edit *edit;
struct nk_window *win;

NK_ASSERT(ctx);
NK_ASSERT(memory);
NK_ASSERT(len);
if (!ctx || !memory || !len)
return 0;

filter = (!filter) ? nk_filter_default: filter;
win = ctx->current;
hash = win->edit.seq;
edit = &ctx->text_edit;
nk_textedit_clear_state(&ctx->text_edit, (flags & NK_EDIT_MULTILINE)?
NK_TEXT_EDIT_MULTI_LINE: NK_TEXT_EDIT_SINGLE_LINE, filter);

if (win->edit.active && hash == win->edit.name) {
if (flags & NK_EDIT_NO_CURSOR)
edit->cursor = nk_utf_len(memory, *len);
else edit->cursor = win->edit.cursor;
if (!(flags & NK_EDIT_SELECTABLE)) {
edit->select_start = win->edit.cursor;
edit->select_end = win->edit.cursor;
} else {
edit->select_start = win->edit.sel_start;
edit->select_end = win->edit.sel_end;
}
edit->mode = win->edit.mode;
edit->scrollbar.x = (float)win->edit.scrollbar.x;
edit->scrollbar.y = (float)win->edit.scrollbar.y;
edit->active = nk_true;
} else edit->active = nk_false;

max = NK_MAX(1, max);
*len = NK_MIN(*len, max-1);
nk_str_init_fixed(&edit->string, memory, (nk_size)max);
edit->string.buffer.allocated = (nk_size)*len;
edit->string.len = nk_utf_len(memory, *len);
state = nk_edit_buffer(ctx, flags, edit, filter);
*len = (int)edit->string.buffer.allocated;

if (edit->active) {
win->edit.cursor = edit->cursor;
win->edit.sel_start = edit->select_start;
win->edit.sel_end = edit->select_end;
win->edit.mode = edit->mode;
win->edit.scrollbar.x = (nk_uint)edit->scrollbar.x;
win->edit.scrollbar.y = (nk_uint)edit->scrollbar.y;
} return state;
}